

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.hpp
# Opt level: O2

void __thiscall
soplex::
Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::validateSolveReal(Validation<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this,SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *soplex)

{
  string *__lhs;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  long lVar2;
  long lVar3;
  double a;
  Real RVar4;
  bool bVar5;
  type_conflict5 tVar6;
  bool bVar7;
  ostream *poVar8;
  ostream *poVar9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  shared_ptr<soplex::Tolerances> *psVar10;
  string reason;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxBoundViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumDualViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRedCostViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumRowViolation;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumBoundViolation;
  undefined1 local_7d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_7d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7c8;
  uint local_7b8 [2];
  uint auStack_7b0 [2];
  uint local_7a8 [2];
  uint auStack_7a0 [2];
  int local_798;
  bool local_794;
  fpclass_type local_790;
  int32_t iStack_78c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  undefined1 local_768 [16];
  size_type local_758;
  uint auStack_750 [2];
  uint local_748 [2];
  uint auStack_740 [2];
  uint local_738 [2];
  uint auStack_730 [2];
  int local_728;
  bool local_724;
  fpclass_type local_720;
  int32_t iStack_71c;
  cpp_dec_float<100U,_int,_void> local_718;
  cpp_dec_float<100U,_int,_void> local_6c8;
  cpp_dec_float<100U,_int,_void> local_678;
  cpp_dec_float<100U,_int,_void> local_628;
  cpp_dec_float<100U,_int,_void> local_5d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_538;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4e8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_498;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_448;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  Tolerances *local_308;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_300;
  size_type local_2f8;
  uint auStack_2f0 [2];
  uint local_2e8 [2];
  uint auStack_2e0 [2];
  uint local_2d8 [2];
  uint auStack_2d0 [2];
  int local_2c8;
  bool local_2c4;
  fpclass_type local_2c0;
  int32_t iStack_2bc;
  Real local_2b8 [10];
  cpp_dec_float<100U,_int,_void> local_268;
  cpp_dec_float<100U,_int,_void> local_218;
  cpp_dec_float<100U,_int,_void> local_1c8;
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  std::__cxx11::string::string((string *)&local_788,"",(allocator *)local_768);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            ((cpp_dec_float<100U,_int,_void> *)local_768,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_5d8,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_628,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_678,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_6c8,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_d8,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_128,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_178,0.0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_1c8,0.0,(type *)0x0);
  local_718.fpclass = cpp_dec_float_finite;
  local_718.prec_elem = 0x10;
  local_718.data._M_elems[0] = 0;
  local_718.data._M_elems[1] = 0;
  local_718.data._M_elems[2] = 0;
  local_718.data._M_elems[3] = 0;
  local_718.data._M_elems[4] = 0;
  local_718.data._M_elems[5] = 0;
  local_718.data._M_elems[6] = 0;
  local_718.data._M_elems[7] = 0;
  local_718.data._M_elems[0xc] = 0;
  local_718.data._M_elems[0xd] = 0;
  local_718.data._M_elems._56_5_ = 0;
  local_718.data._M_elems[0xf]._1_3_ = 0;
  local_718.exp = 0;
  local_718.neg = false;
  local_718.data._M_elems[8] = 0;
  local_718.data._M_elems[9] = 0;
  local_718.data._M_elems[10] = 0;
  local_718.data._M_elems[0xb] = 0;
  poVar9 = (soplex->spxout).m_streams[3];
  __lhs = &this->validatesolution;
  bVar5 = std::operator==(__lhs,"+infinity");
  if (bVar5) {
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_718,
               soplex->_currentSettings->_realParamValues[6]);
  }
  else {
    bVar5 = std::operator==(__lhs,"-infinity");
    if (bVar5) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_718,
                 -soplex->_currentSettings->_realParamValues[6]);
    }
    else {
      a = atof((__lhs->_M_dataplus)._M_p);
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_718,a);
    }
  }
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::objValueReal((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_2b8,soplex);
  local_268.fpclass = cpp_dec_float_finite;
  local_268.prec_elem = 0x10;
  local_268.data._M_elems[0] = 0;
  local_268.data._M_elems[1] = 0;
  local_268.data._M_elems[2] = 0;
  local_268.data._M_elems[3] = 0;
  local_268.data._M_elems[4] = 0;
  local_268.data._M_elems[5] = 0;
  local_268.data._M_elems[6] = 0;
  local_268.data._M_elems[7] = 0;
  local_268.data._M_elems[8] = 0;
  local_268.data._M_elems[9] = 0;
  local_268.data._M_elems[10] = 0;
  local_268.data._M_elems[0xb] = 0;
  local_268.data._M_elems[0xc] = 0;
  local_268.data._M_elems[0xd] = 0;
  local_268.data._M_elems._56_5_ = 0;
  local_268.data._M_elems[0xf]._1_3_ = 0;
  local_268.exp = 0;
  local_268.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_268,&local_718,(cpp_dec_float<100U,_int,_void> *)local_2b8);
  boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            ((type *)local_7d8,(multiprecision *)&local_268,arg);
  local_738[0] = local_7a8[0];
  local_738[1] = local_7a8[1];
  auStack_730[0] = auStack_7a0[0];
  auStack_730[1] = auStack_7a0[1];
  local_748[0] = local_7b8[0];
  local_748[1] = local_7b8[1];
  auStack_740[0] = auStack_7b0[0];
  auStack_740[1] = auStack_7b0[1];
  local_758 = local_7c8._M_allocated_capacity;
  auStack_750[0] = local_7c8._8_4_;
  auStack_750[1] = local_7c8._12_4_;
  local_768._0_8_ = local_7d8;
  local_768._8_8_ = _Stack_7d0._M_pi;
  local_728 = local_798;
  local_724 = local_794;
  local_720 = local_790;
  iStack_71c = iStack_78c;
  if (soplex->_status == INForUNBD) {
    local_7d8 = (undefined1  [8])soplex->_currentSettings->_realParamValues[6];
    tVar6 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_718,(double *)local_7d8);
    if (!tVar6) {
      local_2b8[0] = (Real)((ulong)soplex->_currentSettings->_realParamValues[6] ^
                           0x8000000000000000);
      tVar6 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_718,local_2b8);
      if (!tVar6) goto LAB_002c4d6e;
    }
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_768,0.0);
  }
LAB_002c4d6e:
  local_2d8[0] = local_738[0];
  local_2d8[1] = local_738[1];
  auStack_2d0[0] = auStack_730[0];
  auStack_2d0[1] = auStack_730[1];
  local_2e8[0] = local_748[0];
  local_2e8[1] = local_748[1];
  auStack_2e0[0] = auStack_740[0];
  auStack_2e0[1] = auStack_740[1];
  local_2f8 = local_758;
  auStack_2f0[0] = auStack_750[0];
  auStack_2f0[1] = auStack_750[1];
  local_308 = (Tolerances *)local_768._0_8_;
  p_Stack_300 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_768._8_8_;
  local_2c8 = local_728;
  local_2c4 = local_724;
  local_2c0 = local_720;
  iStack_2bc = iStack_71c;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
            (&local_218,0.0,(type *)0x0);
  local_88.m_backend.data._M_elems._0_8_ =
       *(undefined8 *)(this->validatetolerance).m_backend.data._M_elems;
  local_88.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
  local_88.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
  local_88.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
  local_88.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
  local_88.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 10);
  local_88.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xc);
  local_88.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xe);
  local_88.m_backend.exp = (this->validatetolerance).m_backend.exp;
  local_88.m_backend.neg = (this->validatetolerance).m_backend.neg;
  local_88.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
  local_88.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
  bVar5 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_308,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_218,&local_88);
  if (!bVar5) {
    std::__cxx11::string::append((char *)&local_788);
  }
  if (soplex->_status == OPTIMAL) {
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getBoundViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_5d8,
                        (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_d8);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRowViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_628,
                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_128);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getRedCostViolation
              (soplex,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_678,
               (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_178);
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getDualViolation(soplex,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_6c8,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_1c8);
    pnVar1 = &this->validatetolerance;
    local_358.m_backend.data._M_elems[0xc] = local_5d8.data._M_elems[0xc];
    local_358.m_backend.data._M_elems[0xd] = local_5d8.data._M_elems[0xd];
    local_358.m_backend.data._M_elems[0xe] = local_5d8.data._M_elems[0xe];
    local_358.m_backend.data._M_elems[0xf] = local_5d8.data._M_elems[0xf];
    local_358.m_backend.data._M_elems[8] = local_5d8.data._M_elems[8];
    local_358.m_backend.data._M_elems[9] = local_5d8.data._M_elems[9];
    local_358.m_backend.data._M_elems[10] = local_5d8.data._M_elems[10];
    local_358.m_backend.data._M_elems[0xb] = local_5d8.data._M_elems[0xb];
    local_358.m_backend.data._M_elems[4] = local_5d8.data._M_elems[4];
    local_358.m_backend.data._M_elems[5] = local_5d8.data._M_elems[5];
    local_358.m_backend.data._M_elems[6] = local_5d8.data._M_elems[6];
    local_358.m_backend.data._M_elems[7] = local_5d8.data._M_elems[7];
    local_358.m_backend.data._M_elems[0] = local_5d8.data._M_elems[0];
    local_358.m_backend.data._M_elems[1] = local_5d8.data._M_elems[1];
    local_358.m_backend.data._M_elems[2] = local_5d8.data._M_elems[2];
    local_358.m_backend.data._M_elems[3] = local_5d8.data._M_elems[3];
    local_358.m_backend.exp = local_5d8.exp;
    local_358.m_backend.neg = local_5d8.neg;
    local_358.m_backend.fpclass = local_5d8.fpclass;
    local_358.m_backend.prec_elem = local_5d8.prec_elem;
    local_3a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
    local_3a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_3a8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_3a8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_3a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_3a8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 10);
    local_3a8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xc);
    local_3a8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xe);
    local_3a8.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_3a8.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_3a8.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_3a8.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    psVar10 = &soplex->_tolerances;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_7d8,
               &psVar10->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar4 = Tolerances::epsilon((Tolerances *)local_7d8);
    bVar7 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_358,&local_3a8,RVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_7d0);
    if (!bVar7) {
      std::__cxx11::string::append((char *)&local_788);
      bVar5 = false;
    }
    local_3f8.m_backend.data._M_elems[0xc] = local_628.data._M_elems[0xc];
    local_3f8.m_backend.data._M_elems[0xd] = local_628.data._M_elems[0xd];
    local_3f8.m_backend.data._M_elems[0xe] = local_628.data._M_elems[0xe];
    local_3f8.m_backend.data._M_elems[0xf] = local_628.data._M_elems[0xf];
    local_3f8.m_backend.data._M_elems[8] = local_628.data._M_elems[8];
    local_3f8.m_backend.data._M_elems[9] = local_628.data._M_elems[9];
    local_3f8.m_backend.data._M_elems[10] = local_628.data._M_elems[10];
    local_3f8.m_backend.data._M_elems[0xb] = local_628.data._M_elems[0xb];
    local_3f8.m_backend.data._M_elems[4] = local_628.data._M_elems[4];
    local_3f8.m_backend.data._M_elems[5] = local_628.data._M_elems[5];
    local_3f8.m_backend.data._M_elems[6] = local_628.data._M_elems[6];
    local_3f8.m_backend.data._M_elems[7] = local_628.data._M_elems[7];
    local_3f8.m_backend.data._M_elems[0] = local_628.data._M_elems[0];
    local_3f8.m_backend.data._M_elems[1] = local_628.data._M_elems[1];
    local_3f8.m_backend.data._M_elems[2] = local_628.data._M_elems[2];
    local_3f8.m_backend.data._M_elems[3] = local_628.data._M_elems[3];
    local_3f8.m_backend.exp = local_628.exp;
    local_3f8.m_backend.neg = local_628.neg;
    local_3f8.m_backend.fpclass = local_628.fpclass;
    local_3f8.m_backend.prec_elem = local_628.prec_elem;
    local_448.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
    local_448.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_448.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_448.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_448.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_448.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 10);
    local_448.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xc);
    local_448.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xe);
    local_448.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_448.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_448.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_448.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_7d8,
               &psVar10->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar4 = Tolerances::epsilon((Tolerances *)local_7d8);
    bVar7 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_3f8,&local_448,RVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_7d0);
    if (!bVar7) {
      std::__cxx11::string::append((char *)&local_788);
      bVar5 = false;
    }
    local_498.m_backend.data._M_elems[0xc] = local_678.data._M_elems[0xc];
    local_498.m_backend.data._M_elems[0xd] = local_678.data._M_elems[0xd];
    local_498.m_backend.data._M_elems[0xe] = local_678.data._M_elems[0xe];
    local_498.m_backend.data._M_elems[0xf] = local_678.data._M_elems[0xf];
    local_498.m_backend.data._M_elems[8] = local_678.data._M_elems[8];
    local_498.m_backend.data._M_elems[9] = local_678.data._M_elems[9];
    local_498.m_backend.data._M_elems[10] = local_678.data._M_elems[10];
    local_498.m_backend.data._M_elems[0xb] = local_678.data._M_elems[0xb];
    local_498.m_backend.data._M_elems[4] = local_678.data._M_elems[4];
    local_498.m_backend.data._M_elems[5] = local_678.data._M_elems[5];
    local_498.m_backend.data._M_elems[6] = local_678.data._M_elems[6];
    local_498.m_backend.data._M_elems[7] = local_678.data._M_elems[7];
    local_498.m_backend.data._M_elems[0] = local_678.data._M_elems[0];
    local_498.m_backend.data._M_elems[1] = local_678.data._M_elems[1];
    local_498.m_backend.data._M_elems[2] = local_678.data._M_elems[2];
    local_498.m_backend.data._M_elems[3] = local_678.data._M_elems[3];
    local_498.m_backend.exp = local_678.exp;
    local_498.m_backend.neg = local_678.neg;
    local_498.m_backend.fpclass = local_678.fpclass;
    local_498.m_backend.prec_elem = local_678.prec_elem;
    local_4e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
    local_4e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_4e8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_4e8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_4e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_4e8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 10);
    local_4e8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xc);
    local_4e8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xe);
    local_4e8.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_4e8.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_4e8.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_4e8.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_7d8,
               &psVar10->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar4 = Tolerances::epsilon((Tolerances *)local_7d8);
    bVar7 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_498,&local_4e8,RVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_7d0);
    if (!bVar7) {
      std::__cxx11::string::append((char *)&local_788);
      bVar5 = false;
    }
    local_538.m_backend.data._M_elems[0xc] = local_6c8.data._M_elems[0xc];
    local_538.m_backend.data._M_elems[0xd] = local_6c8.data._M_elems[0xd];
    local_538.m_backend.data._M_elems[0xe] = local_6c8.data._M_elems[0xe];
    local_538.m_backend.data._M_elems[0xf] = local_6c8.data._M_elems[0xf];
    local_538.m_backend.data._M_elems[8] = local_6c8.data._M_elems[8];
    local_538.m_backend.data._M_elems[9] = local_6c8.data._M_elems[9];
    local_538.m_backend.data._M_elems[10] = local_6c8.data._M_elems[10];
    local_538.m_backend.data._M_elems[0xb] = local_6c8.data._M_elems[0xb];
    local_538.m_backend.data._M_elems[4] = local_6c8.data._M_elems[4];
    local_538.m_backend.data._M_elems[5] = local_6c8.data._M_elems[5];
    local_538.m_backend.data._M_elems[6] = local_6c8.data._M_elems[6];
    local_538.m_backend.data._M_elems[7] = local_6c8.data._M_elems[7];
    local_538.m_backend.data._M_elems[0] = local_6c8.data._M_elems[0];
    local_538.m_backend.data._M_elems[1] = local_6c8.data._M_elems[1];
    local_538.m_backend.data._M_elems[2] = local_6c8.data._M_elems[2];
    local_538.m_backend.data._M_elems[3] = local_6c8.data._M_elems[3];
    local_538.m_backend.exp = local_6c8.exp;
    local_538.m_backend.neg = local_6c8.neg;
    local_538.m_backend.fpclass = local_6c8.fpclass;
    local_538.m_backend.prec_elem = local_6c8.prec_elem;
    local_588.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
    local_588.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 2);
    local_588.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 4);
    local_588.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 6);
    local_588.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 8);
    local_588.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 10);
    local_588.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xc);
    local_588.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((this->validatetolerance).m_backend.data._M_elems + 0xe);
    local_588.m_backend.exp = (this->validatetolerance).m_backend.exp;
    local_588.m_backend.neg = (this->validatetolerance).m_backend.neg;
    local_588.m_backend.fpclass = (this->validatetolerance).m_backend.fpclass;
    local_588.m_backend.prec_elem = (this->validatetolerance).m_backend.prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)local_7d8,
               &psVar10->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    RVar4 = Tolerances::epsilon((Tolerances *)local_7d8);
    bVar7 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_538,&local_588,RVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_7d0);
    if (!bVar7) {
      std::__cxx11::string::append((char *)&local_788);
      bVar5 = false;
    }
  }
  std::operator<<(poVar9,"\n");
  std::operator<<(poVar9,"Validation          :");
  if (bVar5 == false) {
    local_788._M_dataplus._M_p[local_788._M_string_length - 2] = ']';
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                   " Fail [",&local_788);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                   "\n");
    std::operator<<(poVar9,(string *)local_7d8);
    std::__cxx11::string::~string((string *)local_7d8);
    std::__cxx11::string::~string((string *)local_2b8);
  }
  else {
    std::operator<<(poVar9," Success\n");
  }
  poVar8 = std::operator<<(poVar9,"   Objective        : ");
  lVar2 = *(long *)poVar8;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 8) = 8;
  poVar8 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)local_768);
  *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
       *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar9,"   Bound            : ");
  lVar2 = *(long *)poVar8;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 8) = 8;
  poVar8 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_5d8);
  *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
       *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar9,"   Row              : ");
  lVar2 = *(long *)poVar8;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 8) = 8;
  poVar8 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_628);
  *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
       *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar8,"\n");
  poVar8 = std::operator<<(poVar9,"   Reduced Cost     : ");
  lVar2 = *(long *)poVar8;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar8 + *(long *)(lVar2 + -0x18) + 8) = 8;
  poVar8 = boost::multiprecision::operator<<
                     (poVar8,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_678);
  *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
       *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar8,"\n");
  poVar9 = std::operator<<(poVar9,"   Dual             : ");
  lVar2 = *(long *)poVar9;
  lVar3 = *(long *)(lVar2 + -0x18);
  *(uint *)(poVar9 + lVar3 + 0x18) = *(uint *)(poVar9 + lVar3 + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar9 + *(long *)(lVar2 + -0x18) + 8) = 8;
  poVar9 = boost::multiprecision::operator<<
                     (poVar9,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_6c8);
  *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
       *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xfffffefb | 4;
  std::operator<<(poVar9,"\n");
  std::__cxx11::string::~string((string *)&local_788);
  return;
}

Assistant:

void Validation<R>::validateSolveReal(SoPlexBase<R>& soplex)
{
   bool passedValidation = true;
   std::string reason = "";
   R objViolation = 0.0;
   R maxBoundViolation = 0.0;
   R maxRowViolation = 0.0;
   R maxRedCostViolation = 0.0;
   R maxDualViolation = 0.0;
   R sumBoundViolation = 0.0;
   R sumRowViolation = 0.0;
   R sumRedCostViolation = 0.0;
   R sumDualViolation = 0.0;
   R sol;

   std::ostream& os = soplex.spxout.getStream(SPxOut::INFO1);

   if(validatesolution == "+infinity")
   {
      sol = soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else if(validatesolution == "-infinity")
   {
      sol = -soplex.realParam(SoPlexBase<R>::INFTY);
   }
   else
   {
      sol = atof(validatesolution.c_str());
   }

   objViolation = spxAbs(sol - soplex.objValueReal());

   // skip check in case presolving detected infeasibility/unboundedness
   if(SPxSolverBase<R>::INForUNBD == soplex.status() &&
         (sol == soplex.realParam(SoPlexBase<R>::INFTY)
          || sol == -soplex.realParam(SoPlexBase<R>::INFTY)))
      objViolation = 0.0;

   if(! EQ(objViolation, R(0.0), validatetolerance))
   {
      passedValidation = false;
      reason += "Objective Violation; ";
   }

   if(SPxSolverBase<R>::OPTIMAL == soplex.status())
   {
      soplex.getBoundViolation(maxBoundViolation, sumBoundViolation);
      soplex.getRowViolation(maxRowViolation, sumRowViolation);
      soplex.getRedCostViolation(maxRedCostViolation, sumRedCostViolation);
      soplex.getDualViolation(maxDualViolation, sumDualViolation);

      if(! LE(maxBoundViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Bound Violation; ";
      }

      if(! LE(maxRowViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Row Violation; ";
      }

      if(! LE(maxRedCostViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Reduced Cost Violation; ";
      }

      if(! LE(maxDualViolation, validatetolerance, soplex.tolerances()->epsilon()))
      {
         passedValidation = false;
         reason += "Dual Violation; ";
      }
   }

   os << "\n";
   os << "Validation          :";

   if(passedValidation)
      os << " Success\n";
   else
   {
      reason[reason.length() - 2] = ']';
      os << " Fail [" + reason + "\n";
   }

   os << "   Objective        : " << std::scientific << std::setprecision(
         8) << objViolation << std::fixed << "\n";
   os << "   Bound            : " << std::scientific << std::setprecision(
         8) << maxBoundViolation << std::fixed << "\n";
   os << "   Row              : " << std::scientific << std::setprecision(
         8) << maxRowViolation << std::fixed << "\n";
   os << "   Reduced Cost     : " << std::scientific << std::setprecision(
         8) << maxRedCostViolation << std::fixed << "\n";
   os << "   Dual             : " << std::scientific << std::setprecision(
         8) << maxDualViolation << std::fixed << "\n";
}